

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
ElementsTransactionApi_FundRawTransaction_Check1_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Check1_Test *this)

{
  initializer_list<TestFundElementsUtxoVector> __l;
  ConfidentialAssetId *pCVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  ulong uVar5;
  reference pvVar6;
  char *pcVar7;
  size_type sVar8;
  char *pcVar9;
  char *pcVar10;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_bool>
  pVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar12;
  AssertionResult gtest_ar_7;
  CfdException *except;
  AssertionResult gtest_ar_6;
  ConfidentialTxInReference *txin;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *__range1_1;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  ConfidentialTransactionContext context;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  ConfidentialTransactionController ctx;
  ElementsTransactionApi api;
  CoinSelectionOption option;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  UtxoFilter filter;
  Amount estimate_fee;
  double fee_rate;
  ElementsUtxoAndOption txin_utxo;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  ElementsConfidentialAddress reserve_ct_addr1;
  ElementsConfidentialAddress ct_addr1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  Address addr3;
  Address addr2;
  Address addr1;
  Address addr;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  ConfidentialAssetId fee_asset;
  ExtPubkey key;
  Txid txid;
  TestFundElementsUtxoVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *__range1;
  uint32_t i;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext tx;
  ElementsAddressFactory factory;
  ConfidentialAssetId *in_stack_ffffffffffffd5f8;
  AbstractTxInReference *this_00;
  TestFundElementsUtxoVector *in_stack_ffffffffffffd600;
  ElementsUtxoAndOption *this_01;
  undefined4 in_stack_ffffffffffffd608;
  undefined4 uVar13;
  undefined4 in_stack_ffffffffffffd60c;
  ElementsUtxoAndOption *in_stack_ffffffffffffd610;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *this_02;
  size_type in_stack_ffffffffffffd618;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd620;
  string *in_stack_ffffffffffffd628;
  string *psVar14;
  undefined4 in_stack_ffffffffffffd630;
  undefined4 uVar15;
  undefined4 in_stack_ffffffffffffd634;
  undefined4 in_stack_ffffffffffffd638;
  NetType in_stack_ffffffffffffd63c;
  ElementsAddressFactory *in_stack_ffffffffffffd640;
  vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *in_stack_ffffffffffffd650;
  int in_stack_ffffffffffffd658;
  int in_stack_ffffffffffffd65c;
  int64_t in_stack_ffffffffffffd660;
  undefined7 in_stack_ffffffffffffd668;
  undefined1 in_stack_ffffffffffffd66f;
  undefined4 in_stack_ffffffffffffd670;
  undefined4 in_stack_ffffffffffffd674;
  string *local_27e8;
  CoinSelectionOption *in_stack_ffffffffffffd960;
  CoinSelectionOption *pCVar16;
  AssertHelper local_2570;
  Message local_2568;
  uint32_t local_2560;
  undefined4 local_255c;
  AssertionResult local_2558;
  SigHashType local_2548;
  allocator local_2539;
  string local_2538;
  Privkey local_2518;
  allocator local_24f1;
  string local_24f0;
  Pubkey local_24d0;
  Txid local_24b8;
  OutPoint local_2498;
  reference local_2470;
  ConfidentialTxInReference *local_2468;
  __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
  local_2460;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_2458;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  *local_2440;
  undefined1 in_stack_ffffffffffffdbdf;
  SigHashType *in_stack_ffffffffffffdbe0;
  Privkey *in_stack_ffffffffffffdbe8;
  Pubkey *in_stack_ffffffffffffdbf0;
  OutPoint *in_stack_ffffffffffffdbf8;
  ConfidentialTransactionContext *in_stack_ffffffffffffdc00;
  pointer in_stack_ffffffffffffdc10;
  pointer in_stack_ffffffffffffdc18;
  AssertHelper in_stack_ffffffffffffdcd8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffdce0;
  string local_2318;
  AssertionResult local_22f8;
  AssertHelper local_22e8;
  Message local_22e0;
  string local_22d8;
  AssertionResult local_22b8;
  AssertHelper local_22a8;
  Message local_22a0;
  string local_2298;
  AssertionResult local_2278;
  AssertHelper local_2268;
  Message local_2260;
  size_type local_2258;
  undefined8 local_2250;
  AssertionResult local_2248;
  AssertHelper local_2238;
  Message local_2230;
  int64_t local_2228;
  undefined4 local_221c;
  AssertionResult local_2218;
  AssertHelper local_2208;
  Message local_2200;
  string local_21f8 [32];
  AssertionResult local_21d8;
  string local_21c8 [3];
  ElementsTransactionApi local_2151;
  CoinSelectionOption local_2150;
  string local_20e8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_20c8;
  Amount local_20b0;
  allocator local_2099;
  string local_2098;
  Txid local_2078 [2];
  Txid local_2030 [16];
  string local_1e18 [32];
  int64_t local_1df8;
  undefined1 local_1df0;
  undefined4 local_1de8;
  ConfidentialAssetId local_1dd8 [20];
  Extkey local_1ab8;
  Pubkey local_1a28;
  ElementsConfidentialAddress local_1a10;
  Extkey local_1858;
  Pubkey local_17c8 [12];
  double in_stack_ffffffffffffe960;
  undefined1 in_stack_ffffffffffffe96f;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  *in_stack_ffffffffffffe970;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  *in_stack_ffffffffffffe978;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffe980;
  string *in_stack_ffffffffffffe988;
  ElementsTransactionApi *in_stack_ffffffffffffe990;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe9b0;
  ConfidentialAssetId *in_stack_ffffffffffffe9b8;
  Amount *in_stack_ffffffffffffe9c8;
  UtxoFilter *in_stack_ffffffffffffe9d0;
  CoinSelectionOption *in_stack_ffffffffffffe9d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe9e0;
  NetType_conflict in_stack_ffffffffffffe9e8;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_ffffffffffffe9f0;
  Amount *in_stack_ffffffffffffe9f8;
  Extkey local_15f8;
  Pubkey local_1568;
  ElementsConfidentialAddress local_1550;
  Extkey local_1398;
  Pubkey local_1308;
  ElementsConfidentialAddress local_12f0;
  _Base_ptr local_1138;
  undefined1 local_1130;
  string local_1128;
  string local_1108;
  _Base_ptr local_10e8;
  undefined1 local_10e0;
  string local_10d8;
  string local_10b8;
  _Base_ptr local_1098;
  undefined1 local_1090;
  string local_1088;
  string local_1068;
  undefined1 local_1048 [56];
  string local_1010 [32];
  Address local_ff0;
  allocator local_e69;
  string local_e68 [32];
  Address local_e48;
  allocator local_cc1;
  string local_cc0 [32];
  Address local_ca0;
  allocator local_b19;
  string local_b18 [32];
  Address local_af8;
  _Base_ptr local_978;
  undefined1 local_970;
  Amount local_968;
  string local_958;
  _Base_ptr local_938;
  undefined1 local_930;
  Amount local_928;
  string local_918;
  _Base_ptr local_8f8;
  undefined1 local_8f0;
  Amount local_8e8;
  string local_8d8 [2];
  undefined1 local_888 [48];
  string local_858;
  ExtPubkey local_838;
  ConfidentialAssetId local_7a8;
  Amount local_780;
  Txid local_770;
  Txid local_750;
  Txid local_730;
  reference local_710;
  TestFundElementsUtxoVector *local_708;
  __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
  local_700;
  vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *local_6f8;
  uint local_6ec;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_6e8;
  allocator local_6c9;
  string local_6c8 [32];
  AbstractTransaction local_6a8 [16];
  allocator local_5a6 [2];
  undefined1 local_5a4;
  undefined1 local_5a3;
  undefined1 local_5a2;
  allocator local_5a1;
  allocator local_5a0;
  undefined1 local_59f;
  undefined1 local_59e;
  allocator local_59d;
  allocator local_59c;
  undefined1 local_59b;
  undefined1 local_59a;
  allocator local_599;
  allocator local_598;
  undefined1 local_597;
  undefined1 local_596;
  allocator local_595;
  allocator local_594;
  undefined1 local_593;
  undefined1 local_592;
  allocator local_591;
  allocator local_590;
  undefined1 local_58f;
  undefined1 local_58e;
  allocator local_58d;
  allocator local_58c;
  undefined1 local_58b;
  undefined1 local_58a;
  allocator local_589;
  allocator local_588;
  undefined1 local_587;
  undefined1 local_586;
  allocator local_585;
  allocator local_584;
  undefined1 local_583;
  undefined1 local_582;
  allocator local_581;
  allocator local_580;
  undefined1 local_57f;
  undefined1 local_57e;
  allocator local_57d;
  allocator local_57c;
  undefined1 local_57b;
  undefined1 local_57a;
  allocator local_579;
  allocator local_578;
  undefined1 local_577;
  undefined1 local_576;
  allocator local_575 [20];
  allocator local_561;
  CoinSelectionOption *local_560;
  string local_558 [32];
  undefined4 local_538;
  pointer local_530;
  string local_528;
  string local_508 [32];
  string local_4e8 [32];
  undefined4 local_4c8;
  pointer local_4c0;
  string sStack_4b8;
  string asStack_498 [32];
  string local_478 [32];
  undefined4 local_458;
  pointer local_450;
  string sStack_448;
  string asStack_428 [32];
  string local_408 [32];
  undefined4 local_3e8;
  pointer local_3e0;
  string sStack_3d8;
  string asStack_3b8 [32];
  string local_398 [32];
  undefined4 local_378;
  pointer local_370;
  string sStack_368;
  string asStack_348 [32];
  CoinSelectionOption local_328;
  string local_2b8 [32];
  undefined4 local_298;
  undefined8 local_290;
  string sStack_288;
  string asStack_268 [32];
  string local_248 [32];
  undefined4 local_228;
  undefined8 local_220;
  string sStack_218;
  string asStack_1f8 [32];
  string local_1d8 [32];
  undefined4 local_1b8;
  undefined8 local_1b0;
  string sStack_1a8;
  string asStack_188 [32];
  string local_168 [32];
  undefined4 local_148;
  undefined8 local_140;
  string sStack_138;
  string asStack_118 [32];
  string local_f8 [32];
  undefined4 local_d8;
  undefined8 local_d0;
  string sStack_c8;
  string asStack_a8 [32];
  string local_88 [32];
  undefined4 local_68;
  undefined8 local_60;
  string sStack_58;
  string asStack_38 [32];
  string *local_18;
  undefined8 local_10;
  
  if ((TestBody()::kFundCoinSelectElementsTestVector3 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3), iVar3 != 0)) {
    local_5a4 = 1;
    local_560 = (CoinSelectionOption *)local_558;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_558,"7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
               &local_561);
    local_577 = 1;
    local_538 = 0;
    local_530 = (pointer)0x12a05f20;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_528,&exp_dummy_asset_a);
    local_576 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_508,
               "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
               local_575);
    local_576 = 0;
    local_577 = 0;
    local_560 = (CoinSelectionOption *)local_4e8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_4e8,"30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
               &local_578);
    local_57b = 1;
    local_4c8 = 0;
    local_4c0 = (pointer)0x4a817c8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_4b8,&exp_dummy_asset_a);
    local_57a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_498,
               "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
               &local_579);
    local_57a = 0;
    local_57b = 0;
    local_560 = (CoinSelectionOption *)local_478;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_478,"9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
               &local_57c);
    local_57f = 1;
    local_458 = 0;
    local_450 = (pointer)0x4a817c80;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_448,&exp_dummy_asset_a);
    local_57e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_428,
               "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
               &local_57d);
    local_57e = 0;
    local_57f = 0;
    local_560 = (CoinSelectionOption *)local_408;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_408,"8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
               &local_580);
    local_583 = 1;
    local_3e8 = 0;
    local_3e0 = (pointer)0x2540be4;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_3d8,&exp_dummy_asset_a);
    local_582 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_3b8,
               "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
               &local_581);
    local_582 = 0;
    local_583 = 0;
    local_560 = (CoinSelectionOption *)local_398;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_398,"4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
               &local_584);
    local_587 = 1;
    local_378 = 0;
    local_370 = (pointer)0x9502f90;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_368,&exp_dummy_asset_a);
    local_586 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_348,
               "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
               &local_585);
    local_586 = 0;
    local_587 = 0;
    pCVar16 = &local_328;
    local_560 = &local_328;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_328,
               "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",&local_588);
    local_58b = 1;
    in_stack_ffffffffffffd960 = pCVar16;
    *(undefined4 *)&pCVar16->knapsack_minimum_change_ = 0;
    pCVar16->dust_fee_rate_ = 2500000000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
              ((string *)&pCVar16->has_ignore_fee_asset_,&exp_dummy_asset_a);
    local_58a = 1;
    pCVar1 = &in_stack_ffffffffffffd960->fee_asset_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)
               &(pCVar1->data_).data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
               &local_589);
    local_58a = 0;
    local_58b = 0;
    local_560 = (CoinSelectionOption *)local_2b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_2b8,"0000000000000000000000000000000000000000000000000000000000000b01",
               &local_58c);
    local_58f = 1;
    local_298 = 0;
    local_290 = 0x19abe00;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_288,&exp_dummy_asset_b);
    local_58e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_268,
               "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
               &local_58d);
    local_58e = 0;
    local_58f = 0;
    local_560 = (CoinSelectionOption *)local_248;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_248,"0000000000000000000000000000000000000000000000000000000000000b02",
               &local_590);
    local_593 = 1;
    local_228 = 0;
    local_220 = 750000;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_218,&exp_dummy_asset_b);
    local_592 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_1f8,
               "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
               &local_591);
    local_592 = 0;
    local_593 = 0;
    local_560 = (CoinSelectionOption *)local_1d8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1d8,"0000000000000000000000000000000000000000000000000000000000000b03",
               &local_594);
    local_597 = 1;
    local_1b8 = 0;
    local_1b0 = 0x14a61a62;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_1a8,&exp_dummy_asset_b);
    local_596 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_188,
               "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
               &local_595);
    local_596 = 0;
    local_597 = 0;
    local_560 = (CoinSelectionOption *)local_168;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_168,"0000000000000000000000000000000000000000000000000000000000000b04",
               &local_598);
    local_59b = 1;
    local_148 = 0;
    local_140 = 0x119ed3e;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_138,&exp_dummy_asset_b);
    local_59a = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_118,
               "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
               &local_599);
    local_59a = 0;
    local_59b = 0;
    local_560 = (CoinSelectionOption *)local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_f8,"0000000000000000000000000000000000000000000000000000000000000c01",
               &local_59c);
    local_59f = 1;
    local_d8 = 0;
    local_d0 = 0x23e8eb8;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_c8,&exp_dummy_asset_c);
    local_59e = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_a8,
               "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
               &local_59d);
    local_59e = 0;
    local_59f = 0;
    local_560 = (CoinSelectionOption *)local_88;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_88,"0000000000000000000000000000000000000000000000000000000000000c02",
               &local_5a0);
    local_5a3 = 1;
    local_68 = 0;
    local_60 = 0x79252f0;
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&sStack_58,&exp_dummy_asset_c);
    local_5a2 = 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (asStack_38,
               "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
               &local_5a1);
    local_5a2 = 0;
    local_5a3 = 0;
    local_5a4 = 0;
    local_18 = local_558;
    local_10 = 0xc;
    std::allocator<TestFundElementsUtxoVector>::allocator
              ((allocator<TestFundElementsUtxoVector> *)0x2e70a0);
    __l._M_array._4_4_ = in_stack_ffffffffffffd63c;
    __l._M_array._0_4_ = in_stack_ffffffffffffd638;
    __l._M_len = (size_type)in_stack_ffffffffffffd640;
    std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::vector
              ((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *)
               CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630),__l,
               (allocator_type *)in_stack_ffffffffffffd628);
    std::allocator<TestFundElementsUtxoVector>::~allocator
              ((allocator<TestFundElementsUtxoVector> *)0x2e70d3);
    local_27e8 = (string *)&local_18;
    do {
      local_27e8 = local_27e8 + -0x70;
      TestFundElementsUtxoVector::~TestFundElementsUtxoVector(in_stack_ffffffffffffd600);
    } while (local_27e8 != local_558);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
    std::allocator<char>::~allocator((allocator<char> *)&local_5a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_59d);
    std::allocator<char>::~allocator((allocator<char> *)&local_59c);
    std::allocator<char>::~allocator((allocator<char> *)&local_599);
    std::allocator<char>::~allocator((allocator<char> *)&local_598);
    std::allocator<char>::~allocator((allocator<char> *)&local_595);
    std::allocator<char>::~allocator((allocator<char> *)&local_594);
    std::allocator<char>::~allocator((allocator<char> *)&local_591);
    std::allocator<char>::~allocator((allocator<char> *)&local_590);
    std::allocator<char>::~allocator((allocator<char> *)&local_58d);
    std::allocator<char>::~allocator((allocator<char> *)&local_58c);
    std::allocator<char>::~allocator((allocator<char> *)&local_589);
    std::allocator<char>::~allocator((allocator<char> *)&local_588);
    std::allocator<char>::~allocator((allocator<char> *)&local_585);
    std::allocator<char>::~allocator((allocator<char> *)&local_584);
    std::allocator<char>::~allocator((allocator<char> *)&local_581);
    std::allocator<char>::~allocator((allocator<char> *)&local_580);
    std::allocator<char>::~allocator((allocator<char> *)&local_57d);
    std::allocator<char>::~allocator((allocator<char> *)&local_57c);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    std::allocator<char>::~allocator((allocator<char> *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)local_575);
    std::allocator<char>::~allocator((allocator<char> *)&local_561);
    __cxa_atexit(std::
                 vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
                 ~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
    __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
  }
  if ((TestBody()::kExpTxData_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_), iVar3 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&TestBody()::kExpTxData_abi_cxx11_,
               "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
               ,local_5a6);
    std::allocator<char>::~allocator((allocator<char> *)local_5a6);
    __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
  }
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_ffffffffffffd640,in_stack_ffffffffffffd63c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_6c8,
             "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
             ,&local_6c9);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffd634,in_stack_ffffffffffffd630),in_stack_ffffffffffffd628
            );
  std::__cxx11::string::~string(local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2e7394);
  std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::size
            (&TestBody::kFundCoinSelectElementsTestVector3);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (in_stack_ffffffffffffd620,in_stack_ffffffffffffd618);
  local_6ec = 0;
  local_6f8 = &TestBody::kFundCoinSelectElementsTestVector3;
  local_700._M_current =
       (TestFundElementsUtxoVector *)
       std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::begin
                 ((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *
                  )in_stack_ffffffffffffd5f8);
  local_708 = (TestFundElementsUtxoVector *)
              std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
              end((vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_> *
                  )in_stack_ffffffffffffd5f8);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffd600,
                            (__normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                             *)in_stack_ffffffffffffd5f8), bVar2) {
    local_710 = __gnu_cxx::
                __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
                ::operator*(&local_700);
    cfd::core::Txid::Txid(&local_730);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      cfd::core::Txid::Txid(&local_750,&local_710->txid);
      cfd::core::Txid::operator=(&local_730,&local_750);
      cfd::core::Txid::~Txid((Txid *)0x2e7486);
    }
    cfd::core::Txid::Txid(&local_770,&local_710->txid);
    pvVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6e8,(ulong)local_6ec);
    cfd::core::Txid::operator=(&pvVar6->txid,&local_770);
    cfd::core::Txid::~Txid((Txid *)0x2e7dd8);
    uVar4 = local_710->vout;
    pvVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6e8,(ulong)local_6ec);
    pvVar6->vout = uVar4;
    cfd::core::Amount::Amount(&local_780,local_710->amount);
    pvVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6e8,(ulong)local_6ec);
    (pvVar6->amount).ignore_check_ = local_780.ignore_check_;
    (pvVar6->amount).amount_ = local_780.amount_;
    cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7a8,&local_710->asset);
    pvVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6e8,(ulong)local_6ec);
    cfd::core::ConfidentialAssetId::operator=(&pvVar6->asset,&local_7a8);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2e7eae);
    psVar14 = &local_710->descriptor;
    pvVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6e8,(ulong)local_6ec);
    std::__cxx11::string::operator=((string *)&pvVar6->descriptor,(string *)psVar14);
    pvVar6 = std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::operator[]
                       (&local_6e8,(ulong)local_6ec);
    pvVar6->address_type = kP2shP2wpkhAddress;
    local_6ec = local_6ec + 1;
    cfd::core::Txid::~Txid((Txid *)0x2e7f2f);
    __gnu_cxx::
    __normal_iterator<const_TestFundElementsUtxoVector_*,_std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>_>
    ::operator++(&local_700);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_858,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,(allocator *)(local_888 + 0x2f));
  cfd::core::ExtPubkey::ExtPubkey(&local_838,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator((allocator<char> *)(local_888 + 0x2f));
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_888,&exp_dummy_asset_a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
         *)0x2e801e);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_8d8,&exp_dummy_asset_a);
  cfd::core::Amount::Amount(&local_8e8,0x6e6f7c0);
  pVar11 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffd610,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
                      (Amount *)in_stack_ffffffffffffd600);
  local_8f8 = (_Base_ptr)pVar11.first._M_node;
  local_8f0 = pVar11.second;
  std::__cxx11::string::~string((string *)local_8d8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_918,&exp_dummy_asset_b);
  cfd::core::Amount::Amount(&local_928,0x14b18c08);
  pVar11 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffd610,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
                      (Amount *)in_stack_ffffffffffffd600);
  local_938 = (_Base_ptr)pVar11.first._M_node;
  local_930 = pVar11.second;
  std::__cxx11::string::~string((string *)&local_918);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_958,&exp_dummy_asset_c);
  cfd::core::Amount::Amount(&local_968,0x23e8e54);
  pVar11 = std::
           map<std::__cxx11::string,cfd::core::Amount,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
           ::emplace<std::__cxx11::string,cfd::core::Amount>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
                       *)in_stack_ffffffffffffd610,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
                      (Amount *)in_stack_ffffffffffffd600);
  local_978 = (_Base_ptr)pVar11.first._M_node;
  local_970 = pVar11.second;
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b18,"ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h",&local_b19);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
             &in_stack_ffffffffffffd600->txid);
  std::__cxx11::string::~string(local_b18);
  std::allocator<char>::~allocator((allocator<char> *)&local_b19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cc0,"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e",&local_cc1);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
             &in_stack_ffffffffffffd600->txid);
  std::__cxx11::string::~string(local_cc0);
  std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e68,"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn",&local_e69);
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
             &in_stack_ffffffffffffd600->txid);
  std::__cxx11::string::~string(local_e68);
  std::allocator<char>::~allocator((allocator<char> *)&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1010,"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m",
             (allocator *)(local_1048 + 0x37));
  cfd::AddressFactory::GetAddress
            ((AddressFactory *)CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
             &in_stack_ffffffffffffd600->txid);
  std::__cxx11::string::~string(local_1010);
  std::allocator<char>::~allocator((allocator<char> *)(local_1048 + 0x37));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x2e8364);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1068,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1088,&local_ca0);
  pVar12 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffd610,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
                      &in_stack_ffffffffffffd600->txid);
  local_1098 = (_Base_ptr)pVar12.first._M_node;
  local_1090 = pVar12.second;
  std::__cxx11::string::~string((string *)&local_1088);
  std::__cxx11::string::~string((string *)&local_1068);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_10b8,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_10d8,&local_e48);
  pVar12 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffd610,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
                      &in_stack_ffffffffffffd600->txid);
  local_10e8 = (_Base_ptr)pVar12.first._M_node;
  local_10e0 = pVar12.second;
  std::__cxx11::string::~string((string *)&local_10d8);
  std::__cxx11::string::~string((string *)&local_10b8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1108,&exp_dummy_asset_c);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1128,&local_ff0);
  pVar12 = std::
           map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
           ::emplace<std::__cxx11::string,std::__cxx11::string>
                     ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_ffffffffffffd610,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608),
                      &in_stack_ffffffffffffd600->txid);
  local_1138 = (_Base_ptr)pVar12.first._M_node;
  local_1130 = pVar12.second;
  std::__cxx11::string::~string((string *)&local_1128);
  std::__cxx11::string::~string((string *)&local_1108);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1398,&local_838,0x5a);
  cfd::core::Extkey::GetPubkey(&local_1308,&local_1398);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_12f0,&local_af8,&local_1308);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e857c);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e8589);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_15f8,&local_838,0x5b);
  cfd::core::Extkey::GetPubkey(&local_1568,&local_15f8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1550,&local_ca0,&local_1568);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e85e8);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e85f5);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1858,&local_838,0x5c);
  cfd::core::Extkey::GetPubkey(local_17c8,&local_1858);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)(local_17c8 + 1),&local_e48,local_17c8);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e8654);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e8661);
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)&local_1ab8,&local_838,0x5d);
  cfd::core::Extkey::GetPubkey(&local_1a28,&local_1ab8);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1a10,&local_ff0,&local_1a28);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e86c0);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2e86cd);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)0x2e86da);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
          *)0x2e86e7);
  cfd::api::ElementsUtxoAndOption::ElementsUtxoAndOption(in_stack_ffffffffffffd610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2098,
             "9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff",&local_2099);
  cfd::core::Txid::Txid(local_2078,&local_2098);
  cfd::core::Txid::operator=(local_2030,local_2078);
  cfd::core::Txid::~Txid((Txid *)0x2e8764);
  std::__cxx11::string::~string((string *)&local_2098);
  std::allocator<char>::~allocator((allocator<char> *)&local_2099);
  cfd::core::Amount::Amount(&local_20b0,0x6b22c20);
  local_1df0 = local_20b0.ignore_check_;
  local_1df8 = local_20b0.amount_;
  cfd::core::ConfidentialAssetId::operator=(local_1dd8,&exp_dummy_asset_a);
  std::__cxx11::string::operator=
            (local_1e18,
             "sh(wpkh([ef735203/0\'/0\'/7\']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x"
            );
  local_1de8 = 6;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
             *)in_stack_ffffffffffffd610,
            (value_type *)CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608));
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd610,
             (value_type *)CONCAT44(in_stack_ffffffffffffd60c,in_stack_ffffffffffffd608));
  local_20c8.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3fc3333333333333;
  cfd::core::Amount::Amount((Amount *)&local_20c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x2e8843);
  cfd::CoinSelectionOption::CoinSelectionOption((CoinSelectionOption *)in_stack_ffffffffffffd600);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_ffffffffffffd960);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffd600,(double)in_stack_ffffffffffffd5f8);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate
            ((CoinSelectionOption *)in_stack_ffffffffffffd600,(double)in_stack_ffffffffffffd5f8);
  cfd::CoinSelectionOption::SetFeeAsset
            ((CoinSelectionOption *)in_stack_ffffffffffffd600,in_stack_ffffffffffffd5f8);
  cfd::CoinSelectionOption::SetBlindInfo(&local_2150,0,0x24);
  cfd::api::ElementsTransactionApi::ElementsTransactionApi(&local_2151);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(local_21c8,local_6a8);
  psVar14 = &local_20e8;
  pcVar10 = local_20e8.field_2._M_local_buf + 0xc;
  this_02 = &local_20c8;
  this_01 = (ElementsUtxoAndOption *)local_888;
  this_00 = (AbstractTxInReference *)local_1048;
  uVar15 = 3;
  uVar13 = 1;
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (in_stack_ffffffffffffe990,in_stack_ffffffffffffe988,in_stack_ffffffffffffe980,
             in_stack_ffffffffffffe978,in_stack_ffffffffffffe970,in_stack_ffffffffffffe9b0,
             in_stack_ffffffffffffe9b8,(bool)in_stack_ffffffffffffe96f,in_stack_ffffffffffffe960,
             in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9d8,
             in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9e8,in_stack_ffffffffffffe9f0,
             in_stack_ffffffffffffe9f8);
  std::__cxx11::string::~string((string *)local_21c8);
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)this_00);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            (pcVar10,(char *)this_02,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffd60c,uVar13),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01);
  std::__cxx11::string::~string(local_21f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_21d8);
  if (!bVar2) {
    testing::Message::Message(&local_2200);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x2e8ff9);
    testing::internal::AssertHelper::AssertHelper
              (&local_2208,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x618,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2208,&local_2200);
    testing::internal::AssertHelper::~AssertHelper(&local_2208);
    testing::Message::~Message((Message *)0x2e905c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e90b4);
  local_221c = 0x26a;
  local_2228 = cfd::core::Amount::GetSatoshiValue((Amount *)&local_20c8);
  testing::internal::EqHelper<false>::Compare<int,long>
            (pcVar10,(char *)this_02,(int *)CONCAT44(in_stack_ffffffffffffd60c,uVar13),
             (long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2218);
  if (!bVar2) {
    testing::Message::Message(&local_2230);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x2e9182);
    testing::internal::AssertHelper::AssertHelper
              (&local_2238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x619,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2238,&local_2230);
    testing::internal::AssertHelper::~AssertHelper(&local_2238);
    testing::Message::~Message((Message *)0x2e91e5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e923d);
  local_2250 = 3;
  local_2258 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_20e8);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (pcVar10,(char *)this_02,(unsigned_long *)CONCAT44(in_stack_ffffffffffffd60c,uVar13),
             (unsigned_long *)this_01);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2248);
  if (!bVar2) {
    testing::Message::Message(&local_2260);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x2e92fa);
    testing::internal::AssertHelper::AssertHelper
              (&local_2268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x61a,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2268,&local_2260);
    testing::internal::AssertHelper::~AssertHelper(&local_2268);
    testing::Message::~Message((Message *)0x2e935d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e93b5);
  sVar8 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_20e8);
  if (sVar8 == 3) {
    cfd::core::Address::GetAddress_abi_cxx11_(&local_2298,&local_ca0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_20e8,2);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2278,"addr1.GetAddress().c_str()",
               "append_txout_addresses[2].c_str()",pcVar7,pcVar9);
    std::__cxx11::string::~string((string *)&local_2298);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2278);
    if (!bVar2) {
      testing::Message::Message(&local_22a0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x2e94dc);
      testing::internal::AssertHelper::AssertHelper
                (&local_22a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61d,pcVar7);
      testing::internal::AssertHelper::operator=(&local_22a8,&local_22a0);
      testing::internal::AssertHelper::~AssertHelper(&local_22a8);
      testing::Message::~Message((Message *)0x2e953f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e9597);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_22d8,&local_e48);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_20e8,0);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_22b8,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",pcVar7,pcVar9);
    std::__cxx11::string::~string((string *)&local_22d8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_22b8);
    if (!bVar2) {
      testing::Message::Message(&local_22e0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x2e96a6);
      testing::internal::AssertHelper::AssertHelper
                (&local_22e8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61e,pcVar7);
      testing::internal::AssertHelper::operator=(&local_22e8,&local_22e0);
      testing::internal::AssertHelper::~AssertHelper(&local_22e8);
      testing::Message::~Message((Message *)0x2e9709);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e9761);
    cfd::core::Address::GetAddress_abi_cxx11_(&local_2318,&local_ff0);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_20e8,1);
    pcVar9 = (char *)std::__cxx11::string::c_str();
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_22f8,"addr3.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",pcVar7,pcVar9);
    std::__cxx11::string::~string((string *)&local_2318);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_22f8);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xffffffffffffdce0);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)0x2e9871);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xffffffffffffdcd8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61f,pcVar7);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xffffffffffffdcd8,(Message *)&stack0xffffffffffffdce0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffdcd8);
      testing::Message::~Message((Message *)0x2e98d4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e9929);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_((AbstractTransactionController *)this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)CONCAT44(in_stack_ffffffffffffd634,uVar15),psVar14);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffdbe0);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x2e998d);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd60c,uVar13));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd60c,uVar13));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd60c,uVar13));
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)this_02,(value_type *)CONCAT44(in_stack_ffffffffffffd60c,uVar13));
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffdce0.ptr_,
             (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             in_stack_ffffffffffffdcd8.data_);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)in_stack_ffffffffffffdce0.ptr_,
             (vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)
             in_stack_ffffffffffffdcd8.data_);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_ffffffffffffd674,in_stack_ffffffffffffd670),
             (vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
              *)CONCAT17(in_stack_ffffffffffffd66f,in_stack_ffffffffffffd668),
             in_stack_ffffffffffffd660,in_stack_ffffffffffffd65c,in_stack_ffffffffffffd658,
             in_stack_ffffffffffffd650);
  cfd::core::ConfidentialTransaction::GetTxInList
            (&local_2458,(ConfidentialTransaction *)&stack0xffffffffffffdc00);
  local_2440 = &local_2458;
  local_2460._M_current =
       (ConfidentialTxInReference *)
       std::
       vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
       ::begin((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                *)this_00);
  local_2468 = (ConfidentialTxInReference *)
               std::
               vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ::end((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
                      *)this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_01,
                            (__normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                             *)this_00), bVar2) {
    local_2470 = __gnu_cxx::
                 __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
                 ::operator*(&local_2460);
    cfd::core::AbstractTxInReference::GetTxid(this_00);
    uVar4 = cfd::core::AbstractTxInReference::GetVout(&local_2470->super_AbstractTxInReference);
    cfd::core::OutPoint::OutPoint(&local_2498,&local_24b8,uVar4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_24f0,
               "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",&local_24f1);
    cfd::core::Pubkey::Pubkey(&local_24d0,&local_24f0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_2538,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",
               &local_2539);
    cfd::core::Privkey::FromWif(&local_2518,&local_2538,kCustomChain,true);
    cfd::core::SigHashType::SigHashType(&local_2548);
    this_01 = (ElementsUtxoAndOption *)0x0;
    this_00 = (AbstractTxInReference *)0x0;
    cfd::ConfidentialTransactionContext::SignWithKey
              (in_stack_ffffffffffffdc00,in_stack_ffffffffffffdbf8,in_stack_ffffffffffffdbf0,
               in_stack_ffffffffffffdbe8,in_stack_ffffffffffffdbe0,(bool)in_stack_ffffffffffffdbdf,
               (ByteData256 *)in_stack_ffffffffffffdc10,(ByteData *)in_stack_ffffffffffffdc18);
    cfd::core::Privkey::~Privkey((Privkey *)0x2e9c5a);
    std::__cxx11::string::~string((string *)&local_2538);
    std::allocator<char>::~allocator((allocator<char> *)&local_2539);
    cfd::core::Pubkey::~Pubkey((Pubkey *)0x2e9c81);
    std::__cxx11::string::~string((string *)&local_24f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_24f1);
    cfd::core::OutPoint::~OutPoint((OutPoint *)0x2e9ca8);
    cfd::core::Txid::~Txid((Txid *)0x2e9cb5);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::ConfidentialTxInReference_*,_std::vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>_>
    ::operator++(&local_2460);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector((vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             *)this_02);
  uVar4 = cfd::core::ConfidentialTransaction::GetVsize
                    ((ConfidentialTransaction *)&stack0xffffffffffffdc00);
  if (((uVar4 != 0x1018) &&
      (uVar4 = cfd::core::ConfidentialTransaction::GetVsize
                         ((ConfidentialTransaction *)&stack0xffffffffffffdc00), uVar4 != 0x1019)) &&
     (uVar4 = cfd::core::ConfidentialTransaction::GetVsize
                        ((ConfidentialTransaction *)&stack0xffffffffffffdc00), uVar4 != 0x101a)) {
    local_255c = 100;
    local_2560 = cfd::core::ConfidentialTransaction::GetVsize
                           ((ConfidentialTransaction *)&stack0xffffffffffffdc00);
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              (pcVar10,(char *)this_02,(int *)CONCAT44(in_stack_ffffffffffffd60c,uVar13),
               (uint *)this_01);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2558);
    if (!bVar2) {
      testing::Message::Message(&local_2568);
      pcVar10 = testing::AssertionResult::failure_message((AssertionResult *)0x2e9f01);
      testing::internal::AssertHelper::AssertHelper
                (&local_2570,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x633,pcVar10);
      testing::internal::AssertHelper::operator=(&local_2570,&local_2568);
      testing::internal::AssertHelper::~AssertHelper(&local_2570);
      testing::Message::~Message((Message *)0x2e9f5e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x2e9fb3);
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController
            ((ConfidentialTransactionController *)this_01);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x2e9ffb);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this_02);
  cfd::api::ElementsUtxoAndOption::~ElementsUtxoAndOption(this_01);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector((vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
           *)this_02);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x2ea070);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  cfd::core::Address::~Address((Address *)this_01);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
          *)0x2ea0b1);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x2ea0be);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)0x2ea0cb);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(this_02);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)this_01);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x2ea3e5);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Check1) {
  // from cfd-go
  static const std::vector<TestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);

  try {
    ConfidentialTransactionContext tx("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000");
    std::vector<cfd::UtxoData> utxos;
    utxos.resize(kFundCoinSelectElementsTestVector3.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{115800000}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{347180040}));
    map_target_value.emplace(exp_dummy_asset_c.GetHex(), Amount(int64_t{37654100}));
    Address addr = factory.GetAddress("ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h");
    Address addr1 = factory.GetAddress("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    Address addr2 = factory.GetAddress("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    Address addr3 = factory.GetAddress("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_c.GetHex(), addr3.GetAddress());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        addr, key.DerivePubkey(90).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
        addr3, key.DerivePubkey(93).GetPubkey());
    std::vector<UtxoData> selected_utxos;
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    ElementsUtxoAndOption txin_utxo;
    txin_utxo.utxo.txid = Txid("9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff");
    txin_utxo.utxo.amount = Amount(int64_t{112340000});
    txin_utxo.utxo.asset = exp_dummy_asset_a;
    txin_utxo.utxo.descriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
    txin_utxo.utxo.address_type = AddressType::kP2shP2wpkhAddress;
    selected_txin_utxos.push_back(txin_utxo);
    selected_utxos.push_back(txin_utxo.utxo);
    double fee_rate = 0.15;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(0.15);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);

    EXPECT_EQ(kExpTxData, ctx.GetHex());
    EXPECT_EQ(618, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{3}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{3})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[2].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
      EXPECT_STREQ(addr3.GetAddress().c_str(), append_txout_addresses[1].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(ct_addr1);
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    ct_addrs.push_back(reserve_ct_addr3);
    context.CollectInputUtxo(selected_utxos);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5"));
    }
    if ((context.GetVsize() != 4120) && (context.GetVsize() != 4121) &&
        (context.GetVsize() != 4122)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}